

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::CheckCxxModuleStatus(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  Cxx20SupportLevel CVar2;
  
  bVar1 = HaveCxx20ModuleSources(this);
  if (bVar1) {
    CVar2 = HaveCxxModuleSupport(this,config);
    (*(code *)(&DAT_0064e500 + *(int *)(&DAT_0064e500 + (ulong)CVar2 * 4)))();
    return;
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckCxxModuleStatus(std::string const& config) const
{
  // Check for `CXX_MODULE*` file sets and a lack of support.
  if (this->HaveCxx20ModuleSources()) {
    switch (this->HaveCxxModuleSupport(config)) {
      case cmGeneratorTarget::Cxx20SupportLevel::MissingCxx:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("The \"", this->GetName(),
                   "\" target has C++ module sources but the \"CXX\" language "
                   "has not been enabled"));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::MissingExperimentalFlag:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("The \"", this->GetName(),
                   "\" target has C++ module sources but its experimental "
                   "support has not been requested"));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::NoCxx20:
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(
            "The \"", this->GetName(),
            "\" target has C++ module sources but is not using at least "
            "\"cxx_std_20\""));
        break;
      case cmGeneratorTarget::Cxx20SupportLevel::Supported:
        // All is well.
        break;
    }
  }
}